

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void new_mem_loc(gen_ctx_t gen_ctx,MIR_op_t *mem_op_ref,int flag)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  VARR_mem_attr_t *pVVar5;
  long lVar6;
  int iVar7;
  bitmap_t pVVar8;
  mem_attr_t *pmVar9;
  size_t sVar10;
  uint extraout_EDX;
  size_t sVar11;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  uchar uVar15;
  FILE *pFVar16;
  gen_ctx_t __stream;
  int64_t iVar17;
  gen_ctx_t insn;
  
  if (gen_ctx->mem_attrs == (VARR_mem_attr_t *)0x0) {
    new_mem_loc_cold_4();
    pFVar16 = (FILE *)mem_op_ref;
    __stream = gen_ctx;
LAB_001668e9:
    new_mem_loc_cold_3();
  }
  else {
    iVar7 = (int)gen_ctx->mem_attrs->els_num;
    (mem_op_ref->u).mem.nloc = iVar7 + (uint)(iVar7 == 0);
    bVar1 = *(byte *)&mem_op_ref->u;
    uVar2 = (mem_op_ref->u).mem.alias;
    __stream = (gen_ctx_t)(ulong)uVar2;
    uVar3 = (mem_op_ref->u).mem.nonalias;
    pFVar16 = (FILE *)mem_op_ref;
    if ((flag & 2U) != 0) {
      pVVar8 = (bitmap_t)mem_op_ref->data;
      if (pVVar8 != (bitmap_t)0x0) {
        iVar17 = 0;
        do {
          insn = *(gen_ctx_t *)pVVar8->size;
          __stream = insn;
          iVar7 = move_p((MIR_insn_t)insn);
          if (iVar7 == 0) {
            uVar4 = *(uint *)&insn->debug_file;
            uVar15 = '\x01';
            if ((((0x28 < (ulong)uVar4) || ((0x18c00000000U >> ((ulong)uVar4 & 0x3f) & 1) == 0)) ||
                (insn->call_used_hard_regs[3] == (bitmap_t)0x0)) ||
               (lVar6 = *(long *)((long)insn->call_used_hard_regs[3] + 8),
               *(char *)(lVar6 + 8) == '\0')) goto LAB_00166671;
            lVar6 = *(long *)(lVar6 + 0x18);
            lVar12 = -lVar6;
            if ((uVar4 & 0xfffffffe) == 0x22) {
              lVar12 = lVar6;
            }
            iVar17 = lVar12 + iVar17;
          }
          pVVar8 = insn->temp_bitmap;
        } while (pVVar8 != (bitmap_t)0x0);
      }
      __assert_fail("se != ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0xffc,"ssa_edge_t skip_move_ssa_edges(ssa_edge_t, MIR_insn_t *)");
    }
    insn = (gen_ctx_t)0x0;
    iVar17 = 0;
    uVar15 = '\0';
LAB_00166671:
    pVVar5 = gen_ctx->mem_attrs;
    if (pVVar5 == (VARR_mem_attr_t *)0x0) goto LAB_001668e9;
    if (pVVar5->els_num == 0) {
      pmVar9 = pVVar5->varr;
      if (pmVar9 == (mem_attr_t *)0x0) goto LAB_001668f3;
      if (pVVar5->size == 0) {
        pmVar9 = (mem_attr_t *)realloc(pmVar9,0x20);
        pVVar5->varr = pmVar9;
        pVVar5->size = 1;
        sVar10 = pVVar5->els_num;
        sVar11 = sVar10 + 1;
      }
      else {
        sVar11 = 1;
        sVar10 = 0;
      }
      pVVar5->els_num = sVar11;
      pmVar9[sVar10].alloca_flag = (uchar)flag;
      pmVar9[sVar10].disp_def_p = uVar15;
      pmVar9[sVar10].type = (uint)bVar1;
      pFVar16 = (FILE *)(ulong)uVar3;
      pmVar9[sVar10].alias = uVar2;
      pmVar9[sVar10].nonalias = uVar3;
      pmVar9[sVar10].def_insn = (MIR_insn_t)insn;
      pmVar9[sVar10].disp = iVar17;
    }
    __stream = (gen_ctx_t)gen_ctx->debug_file;
    if ((__stream != (gen_ctx_t)0x0) && (1 < gen_ctx->debug_level)) {
      fprintf((FILE *)__stream,"    new m%lu",(ulong)(mem_op_ref->u).mem.nloc);
      if (insn != (gen_ctx_t)0x0) {
        fprintf((FILE *)gen_ctx->debug_file,"(def_insn=%u)",
                (ulong)*(uint *)((long)&insn->ctx->c2mir_ctx + 4));
      }
      if ((flag & 2U) == 0) {
        if (flag != 0) goto LAB_00166801;
      }
      else {
        fprintf((FILE *)gen_ctx->debug_file,"(disp=%lld)",iVar17);
LAB_00166801:
        pcVar14 = "may/must";
        if ((flag & 3U) == 0) {
          pcVar14 = "must";
        }
        fprintf((FILE *)gen_ctx->debug_file," is %s alloca based",pcVar14);
      }
      pFVar16 = (FILE *)gen_ctx->debug_file;
      __stream = (gen_ctx_t)0xa;
      fputc(10,pFVar16);
    }
    pVVar5 = gen_ctx->mem_attrs;
    pmVar9 = pVVar5->varr;
    if (pmVar9 != (mem_attr_t *)0x0) {
      sVar11 = pVVar5->els_num;
      uVar13 = sVar11 + 1;
      if (pVVar5->size < uVar13) {
        sVar11 = (uVar13 >> 1) + uVar13;
        pmVar9 = (mem_attr_t *)realloc(pmVar9,sVar11 * 0x20);
        pVVar5->varr = pmVar9;
        pVVar5->size = sVar11;
        sVar11 = pVVar5->els_num;
        uVar13 = sVar11 + 1;
      }
      pVVar5->els_num = uVar13;
      pmVar9[sVar11].alloca_flag = (uchar)flag;
      pmVar9[sVar11].disp_def_p = uVar15;
      pmVar9[sVar11].type = (uint)bVar1;
      pmVar9[sVar11].alias = uVar2;
      pmVar9[sVar11].nonalias = uVar3;
      pmVar9[sVar11].def_insn = (MIR_insn_t)insn;
      pmVar9[sVar11].disp = iVar17;
      return;
    }
  }
  new_mem_loc_cold_1();
LAB_001668f3:
  new_mem_loc_cold_2();
  pVVar5 = __stream->mem_attrs;
  if (pVVar5 == (VARR_mem_attr_t *)0x0) {
    update_mem_loc_alloca_flag_cold_1();
  }
  else if (pFVar16 < (FILE *)pVVar5->els_num) {
    bVar1 = pVVar5->varr[(long)pFVar16].alloca_flag;
    pVVar5->varr[(long)pFVar16].alloca_flag =
         (byte)extraout_EDX & bVar1 & 2 | (bVar1 | (byte)extraout_EDX) & 1;
    if ((((FILE *)__stream->debug_file != (FILE *)0x0) &&
        (1 < *(int *)&((MIR_op_t *)&__stream->debug_level)->data)) && (bVar1 != extraout_EDX)) {
      fprintf((FILE *)__stream->debug_file,"    m%lu ");
      if (extraout_EDX == 0) {
        fwrite("is no more alloca based\n",0x18,1,(FILE *)__stream->debug_file);
        return;
      }
      pcVar14 = "may/must";
      if ((extraout_EDX & 3) == 0) {
        pcVar14 = "must";
      }
      fprintf((FILE *)__stream->debug_file,"becomes %s alloca based\n",pcVar14);
      return;
    }
    return;
  }
  __assert_fail("(VARR_mem_attr_tlength (gen_ctx->mem_attrs)) > nloc",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x103a,"void update_mem_loc_alloca_flag(gen_ctx_t, size_t, int)");
}

Assistant:

static void new_mem_loc (gen_ctx_t gen_ctx, MIR_op_t *mem_op_ref, int flag) {
  /* zero loc is fixed: */
  int64_t disp;
  mem_attr_t mem_attr;

  if ((mem_op_ref->u.var_mem.nloc = (uint32_t) VARR_LENGTH (mem_attr_t, mem_attrs)) == 0)
    mem_op_ref->u.var_mem.nloc = 1;
  mem_attr.alloca_flag = flag;
  mem_attr.type = mem_op_ref->u.var_mem.type;
  mem_attr.alias = mem_op_ref->u.var_mem.alias;
  mem_attr.nonalias = mem_op_ref->u.var_mem.nonalias;
  mem_attr.disp_def_p = FALSE;
  mem_attr.disp = 0;
  mem_attr.def_insn = NULL;
  if ((flag & MUST_ALLOCA) != 0) {
    mem_attr.def_insn = get_def_disp (mem_op_ref->data, &disp);
    mem_attr.disp_def_p = TRUE;
    mem_attr.disp = disp;
  }
  if (VARR_LENGTH (mem_attr_t, mem_attrs) == 0) VARR_PUSH (mem_attr_t, mem_attrs, mem_attr);
  DEBUG (2, {
    fprintf (debug_file, "    new m%lu", (unsigned long) mem_op_ref->u.var_mem.nloc);
    if (mem_attr.def_insn != NULL)
      fprintf (debug_file, "(def_insn=%u)", ((bb_insn_t) mem_attr.def_insn->data)->index);
    if (mem_attr.disp_def_p) fprintf (debug_file, "(disp=%lld)", (long long) mem_attr.disp);
    if (flag)
      fprintf (debug_file, " is %s alloca based",
               flag & (MAY_ALLOCA | MUST_ALLOCA) ? "may/must"
               : flag & MAY_ALLOCA               ? "may"
                                                 : "must");
    fprintf (debug_file, "\n");
  });
  VARR_PUSH (mem_attr_t, mem_attrs, mem_attr);
}